

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O2

int Abc_CommandCSweep(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  uint nLeafMax;
  Abc_Ntk_t *pAVar2;
  char *pcVar3;
  uint fVerbose;
  int iVar4;
  uint local_4c;
  
  pAVar2 = Abc_FrameReadNtk(pAbc);
  fVerbose = 0;
  Extra_UtilGetoptReset();
  nLeafMax = 6;
  local_4c = 8;
  do {
    while( true ) {
      while (iVar1 = Extra_UtilGetopt(argc,argv,"CKvh"), iVar4 = globalUtilOptind, iVar1 == 0x76) {
        fVerbose = fVerbose ^ 1;
      }
      if (iVar1 == -1) {
        if (pAVar2 == (Abc_Ntk_t *)0x0) {
          pcVar3 = "Empty network.\n";
        }
        else if (local_4c < 2) {
          pcVar3 = "The number of cuts cannot be less than 2.\n";
        }
        else if (nLeafMax - 0x11 < 0xfffffff2) {
          pcVar3 = "The number of leaves is infeasible.\n";
        }
        else {
          if (pAVar2->ntkType == ABC_NTK_STRASH) {
            pAVar2 = Abc_NtkCSweep(pAVar2,local_4c,nLeafMax,fVerbose);
            if (pAVar2 != (Abc_Ntk_t *)0x0) {
              Abc_FrameReplaceCurrentNetwork(pAbc,pAVar2);
              return 0;
            }
            Abc_Print(-1,"Command has failed.\n");
            return 0;
          }
          pcVar3 = "This command works only for strashed networks.\n";
        }
        iVar4 = -1;
        goto LAB_001ff601;
      }
      if (iVar1 == 0x4b) break;
      if (iVar1 != 0x43) goto LAB_001ff583;
      if (argc <= globalUtilOptind) {
        pcVar3 = "Command line switch \"-C\" should be followed by an integer.\n";
LAB_001ff574:
        Abc_Print(-1,pcVar3);
        goto LAB_001ff583;
      }
      local_4c = atoi(argv[globalUtilOptind]);
      globalUtilOptind = iVar4 + 1;
      if ((int)local_4c < 0) goto LAB_001ff583;
    }
    if (argc <= globalUtilOptind) {
      pcVar3 = "Command line switch \"-K\" should be followed by an integer.\n";
      goto LAB_001ff574;
    }
    nLeafMax = atoi(argv[globalUtilOptind]);
    globalUtilOptind = iVar4 + 1;
  } while (-1 < (int)nLeafMax);
LAB_001ff583:
  iVar4 = -2;
  Abc_Print(-2,"usage: csweep [-C num] [-K num] [-vh]\n");
  Abc_Print(-2,"\t         performs cut sweeping using a new method\n");
  Abc_Print(-2,"\t-C num : limit on the number of cuts (C >= 2) [default = %d]\n",(ulong)local_4c);
  Abc_Print(-2,"\t-K num : limit on the cut size (3 <= K <= 16) [default = %d]\n",(ulong)nLeafMax);
  pcVar3 = "yes";
  if (fVerbose == 0) {
    pcVar3 = "no";
  }
  Abc_Print(-2,"\t-v     : toggle verbose printout [default = %s]\n",pcVar3);
  pcVar3 = "\t-h     : print the command usage\n";
LAB_001ff601:
  Abc_Print(iVar4,pcVar3);
  return 1;
}

Assistant:

int Abc_CommandCSweep( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abc_Ntk_t * pNtk, * pNtkRes;
    int c, nCutsMax, nLeafMax, fVerbose;

    extern Abc_Ntk_t * Abc_NtkCSweep( Abc_Ntk_t * pNtk, int nCutsMax, int nLeafMax, int fVerbose );

    pNtk = Abc_FrameReadNtk(pAbc);
    // set defaults
    nCutsMax  =  8;
    nLeafMax  =  6;
    fVerbose  =  0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "CKvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'C':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-C\" should be followed by an integer.\n" );
                goto usage;
            }
            nCutsMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nCutsMax < 0 )
                goto usage;
            break;
        case 'K':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-K\" should be followed by an integer.\n" );
                goto usage;
            }
            nLeafMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nLeafMax < 0 )
                goto usage;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }

    if ( nCutsMax < 2 )
    {
        Abc_Print( -1, "The number of cuts cannot be less than 2.\n" );
        return 1;
    }

    if ( nLeafMax < 3 || nLeafMax > 16 )
    {
        Abc_Print( -1, "The number of leaves is infeasible.\n" );
        return 1;
    }
    if ( !Abc_NtkIsStrash(pNtk) )
    {
        Abc_Print( -1, "This command works only for strashed networks.\n" );
        return 1;
    }

    pNtkRes = Abc_NtkCSweep( pNtk, nCutsMax, nLeafMax, fVerbose );
    if ( pNtkRes == NULL )
    {
        Abc_Print( -1, "Command has failed.\n" );
        return 0;
    }
    // replace the current network
    Abc_FrameReplaceCurrentNetwork( pAbc, pNtkRes );
    return 0;

usage:
    Abc_Print( -2, "usage: csweep [-C num] [-K num] [-vh]\n" );
    Abc_Print( -2, "\t         performs cut sweeping using a new method\n" );
    Abc_Print( -2, "\t-C num : limit on the number of cuts (C >= 2) [default = %d]\n", nCutsMax );
    Abc_Print( -2, "\t-K num : limit on the cut size (3 <= K <= 16) [default = %d]\n", nLeafMax );
    Abc_Print( -2, "\t-v     : toggle verbose printout [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}